

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_OrdinaryIsInstanceOf(JSContext *ctx,JSValue val,JSValue obj)

{
  JSValueUnion JVar1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue obj_00;
  JSValue obj_01;
  JSValue val_00;
  int iVar2;
  JSValueUnion in_RCX;
  int in_EDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  JSValue JVar3;
  JSValue obj1;
  JSAtom in_stack_0000005c;
  JSContext *in_stack_00000060;
  JSBoundFunction *s;
  BOOL ret;
  JSObject *proto1;
  JSObject *p;
  JSObject *proto;
  JSValue obj_proto;
  BOOL in_stack_00000100;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff0c;
  JSValueUnion in_stack_ffffffffffffff10;
  JSValueUnion in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff20;
  int64_t iVar5;
  JSContext *in_stack_ffffffffffffff60;
  JSValueUnion in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion local_78;
  JSValueUnion local_10;
  
  JVar3.tag = in_R8;
  JVar3.u.ptr = in_RCX.ptr;
  iVar2 = JS_IsFunction(in_RDI,JVar3);
  if (iVar2 == 0) {
    return 0;
  }
  if (*(short *)((long)in_RCX.ptr + 6) == 0xe) {
    val_00.u._4_4_ = in_stack_ffffffffffffff7c;
    val_00.u.int32 = in_stack_ffffffffffffff78;
    val_00.tag = in_stack_ffffffffffffff80;
    obj_01.tag = *(int64_t *)((long)in_RCX.ptr + 0x30);
    obj_01.u.float64 = in_stack_ffffffffffffff68.float64;
    iVar2 = JS_IsInstanceOf(in_stack_ffffffffffffff60,val_00,obj_01);
    return iVar2;
  }
  if (in_EDX != -1) {
    return 0;
  }
  uVar4 = 0;
  JVar3 = JS_GetPropertyInternal
                    (in_stack_00000060,_proto1,in_stack_0000005c,(JSValue)_s,in_stack_00000100);
  local_10 = JVar3.u;
  local_78 = in_RSI;
  if ((int)JVar3.tag == -1) {
    do {
      JVar1 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)local_78.ptr + 0x18) + 0x38))->ptr;
      if (JVar1.ptr == (void *)0x0) {
        if (*(short *)((long)local_78.ptr + 6) != 0x29) {
          iVar2 = 0;
          goto LAB_00128656;
        }
        iVar5 = -1;
        v_02.tag = -1;
        v_02.u.ptr = local_78.ptr;
        JS_DupValue(in_RDI,v_02);
        goto LAB_0012853e;
      }
      local_78 = JVar1;
    } while (local_10.ptr != JVar1.ptr);
    iVar2 = 1;
  }
  else {
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      JS_ThrowTypeError(in_RDI,"operand \'prototype\' property is not an object");
    }
    iVar2 = -1;
  }
  goto LAB_00128656;
  while( true ) {
    if (local_10.ptr == JVar3.u.ptr) {
      v.tag = (int64_t)local_78.ptr;
      v.u.ptr = in_stack_ffffffffffffff18.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff10.ptr,v);
      iVar2 = 1;
      in_stack_ffffffffffffff20 = local_78;
      goto LAB_00128656;
    }
    iVar2 = js_poll_interrupts((JSContext *)CONCAT44(in_stack_ffffffffffffff0c,uVar4));
    if (iVar2 != 0) break;
LAB_0012853e:
    obj_00.tag = iVar5;
    obj_00.u.ptr = local_78.ptr;
    JVar3 = JS_GetPrototypeFree((JSContext *)in_stack_ffffffffffffff18.ptr,obj_00);
    in_stack_ffffffffffffff18 = (JSValueUnion)JVar3.tag;
    in_stack_ffffffffffffff10 = JVar3.u;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 != 0) {
      iVar2 = -1;
      in_stack_ffffffffffffff20 = local_78;
      goto LAB_00128656;
    }
    iVar2 = JS_IsNull(JVar3);
    if (iVar2 != 0) {
      iVar2 = 0;
      in_stack_ffffffffffffff20 = local_78;
      goto LAB_00128656;
    }
  }
  v_00.tag = (int64_t)local_78.ptr;
  v_00.u.ptr = in_stack_ffffffffffffff18.ptr;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff10.ptr,v_00);
  iVar2 = -1;
  in_stack_ffffffffffffff20 = local_78;
LAB_00128656:
  v_01.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
  v_01.u.float64 = in_stack_ffffffffffffff18.float64;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff10.ptr,v_01);
  return iVar2;
}

Assistant:

static int JS_OrdinaryIsInstanceOf(JSContext *ctx, JSValueConst val,
                                   JSValueConst obj)
{
    JSValue obj_proto;
    JSObject *proto;
    const JSObject *p, *proto1;
    BOOL ret;

    if (!JS_IsFunction(ctx, obj))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (p->class_id == JS_CLASS_BOUND_FUNCTION) {
        JSBoundFunction *s = p->u.bound_function;
        return JS_IsInstanceOf(ctx, val, s->func_obj);
    }

    /* Only explicitly boxed values are instances of constructors */
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    obj_proto = JS_GetProperty(ctx, obj, JS_ATOM_prototype);
    if (JS_VALUE_GET_TAG(obj_proto) != JS_TAG_OBJECT) {
        if (!JS_IsException(obj_proto))
            JS_ThrowTypeError(ctx, "operand 'prototype' property is not an object");
        ret = -1;
        goto done;
    }
    proto = JS_VALUE_GET_OBJ(obj_proto);
    p = JS_VALUE_GET_OBJ(val);
    for(;;) {
        proto1 = p->shape->proto;
        if (!proto1) {
            /* slow case if proxy in the prototype chain */
            if (unlikely(p->class_id == JS_CLASS_PROXY)) {
                JSValue obj1;
                obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, (JSObject *)p));
                for(;;) {
                    obj1 = JS_GetPrototypeFree(ctx, obj1);
                    if (JS_IsException(obj1)) {
                        ret = -1;
                        break;
                    }
                    if (JS_IsNull(obj1)) {
                        ret = FALSE;
                        break;
                    }
                    if (proto == JS_VALUE_GET_OBJ(obj1)) {
                        JS_FreeValue(ctx, obj1);
                        ret = TRUE;
                        break;
                    }
                    /* must check for timeout to avoid infinite loop */
                    if (js_poll_interrupts(ctx)) {
                        JS_FreeValue(ctx, obj1);
                        ret = -1;
                        break;
                    }
                }
            } else {
                ret = FALSE;
            }
            break;
        }
        p = proto1;
        if (proto == p) {
            ret = TRUE;
            break;
        }
    }
done:
    JS_FreeValue(ctx, obj_proto);
    return ret;
}